

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tm.c
# Opt level: O0

bool_t tmDate2(octet *date)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool_t bVar7;
  undefined1 *in_RDI;
  size_t d;
  size_t m;
  size_t y;
  size_t *in_stack_00000020;
  size_t *in_stack_00000028;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  bool_t local_4;
  
  bVar7 = tmDate(in_stack_00000028,in_stack_00000020,(size_t *)date);
  if (bVar7 == 0) {
    local_4 = 0;
  }
  else if ((local_18 < 2000) || (0x833 < local_18)) {
    local_4 = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_18 - 2000;
    *in_RDI = SUB161(auVar1 / ZEXT816(10),0);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_18 - 2000;
    in_RDI[1] = SUB161(auVar2 % ZEXT816(10),0);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_20;
    in_RDI[2] = SUB161(auVar3 / ZEXT816(10),0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_20;
    in_RDI[3] = SUB161(auVar4 % ZEXT816(10),0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_28;
    in_RDI[4] = SUB161(auVar5 / ZEXT816(10),0);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_28;
    in_RDI[5] = SUB161(auVar6 % ZEXT816(10),0);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

bool_t tmDate2(octet date[6])
{
	size_t y;
	size_t m;
	size_t d;
	ASSERT(memIsValid(date, 6));
	// получить дату
	if (!tmDate(&y, &m, &d))
		return FALSE;
	// преобразовать дату
	if (y < 2000 || y > 2099)
		return FALSE;
	y -= 2000;
	date[0] = (octet)(y / 10), date[1] = (octet)(y % 10);
	date[2] = (octet)(m / 10), date[3] = (octet)(m % 10);
	date[4] = (octet)(d / 10), date[5] = (octet)(d % 10);
	return TRUE;
}